

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O2

void __thiscall
Tokenizer::registerReplacement(Tokenizer *this,Identifier *identifier,string *newValue)

{
  int iVar1;
  long lVar2;
  string lowerCase;
  Replacement replacement;
  Token tok;
  string local_150;
  long local_130;
  long local_128;
  value_type local_110;
  Identifier local_d8;
  string local_b8;
  Token local_98;
  
  std::__cxx11::string::string((string *)&local_130,(string *)newValue);
  for (lVar2 = 0; local_128 != lVar2; lVar2 = lVar2 + 1) {
    iVar1 = tolower((int)*(char *)(local_130 + lVar2));
    *(char *)(local_130 + lVar2) = (char)iVar1;
  }
  local_98.originalText._M_dataplus._M_p = (pointer)&local_98.originalText.field_2;
  local_98.value.super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>.
  super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
  super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
  super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
  super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
  super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>._M_index =
       '\0';
  local_98.line = 0;
  local_98.column._0_5_ = 0;
  local_98.column._5_3_ = 0;
  local_98.checked = false;
  local_98.originalText._M_string_length = 0;
  local_98.originalText.field_2._M_local_buf[0] = '\0';
  local_98.type = Identifier;
  std::__cxx11::string::string((string *)&local_150,(string *)&local_130);
  Identifier::Identifier(&local_d8,&local_150);
  std::__cxx11::string::string((string *)&local_b8,(string *)newValue);
  Token::setValue<Identifier>(&local_98,&local_d8,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_150);
  local_110.identifier._name._M_dataplus._M_p = (pointer)&local_110.identifier._name.field_2;
  local_110.identifier._name._M_string_length = 0;
  local_110.identifier._name.field_2._M_local_buf[0] = '\0';
  local_110.value.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_110.value.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_110.value.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::_M_assign((string *)&local_110);
  std::vector<Token,_std::allocator<Token>_>::push_back(&local_110.value,&local_98);
  std::vector<Tokenizer::Replacement,_std::allocator<Tokenizer::Replacement>_>::push_back
            (&this->replacements,&local_110);
  Replacement::~Replacement(&local_110);
  Token::~Token(&local_98);
  std::__cxx11::string::~string((string *)&local_130);
  return;
}

Assistant:

void Tokenizer::registerReplacement(const Identifier& identifier, const std::string& newValue)
{
	// Ensure the new identifier is lower case as it would be as a normally parsed string
	std::string lowerCase = newValue;
	std::transform(lowerCase.begin(), lowerCase.end(), lowerCase.begin(), ::tolower);

	Token tok;
	tok.type = TokenType::Identifier;
	tok.setValue(Identifier(lowerCase), newValue);

	Replacement replacement;
	replacement.identifier = identifier;
	replacement.value.push_back(tok);

	replacements.push_back(replacement);
}